

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_Utils.h
# Opt level: O3

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::fixupL
          (SparseLUImpl<double,_int> *this,int n,IndexVector *perm_r,GlobalLU_t *glu)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  int *piVar6;
  int *piVar7;
  ulong uVar8;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  
  if ((-1 < n) &&
     (lVar12 = (long)n,
     lVar12 < (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows)) {
    uVar1 = (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
            m_data[lVar12];
    if ((int)uVar1 < 0) {
      uVar15 = (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      iVar10 = 0;
    }
    else {
      piVar4 = (glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      lVar5 = (glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      uVar15 = (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      lVar16 = 0;
      lVar13 = 0;
      if (0 < lVar5) {
        lVar13 = lVar5;
      }
      lVar19 = 1;
      if (1 < lVar5) {
        lVar19 = lVar5;
      }
      piVar6 = (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      iVar10 = 0;
      do {
        if (lVar16 == lVar13) goto LAB_00150c3f;
        uVar2 = piVar4[lVar16];
        lVar17 = (long)(int)uVar2;
        if ((lVar17 < 0) || ((long)uVar15 <= lVar17)) goto LAB_00150c3f;
        uVar18 = (ulong)uVar2;
        iVar3 = piVar6[lVar17];
        lVar14 = (long)iVar3;
        piVar6[lVar17] = iVar10;
        if (uVar15 <= uVar18 + 1) goto LAB_00150c3f;
        if (iVar3 < piVar6[uVar18 + 1]) {
          piVar7 = (glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage
                   .m_data;
          uVar8 = (glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows;
          piVar9 = (perm_r->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          uVar11 = (ulong)iVar10;
          do {
            if ((iVar3 < 0) || ((long)uVar8 <= lVar14)) goto LAB_00150c3f;
            lVar17 = (long)piVar7[lVar14];
            if ((lVar17 < 0) ||
               ((perm_r->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows <= lVar17)) {
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                            ,0xad,
                            "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<int, -1, 1>, Level = 0]"
                           );
            }
            if ((iVar10 < 0) || (uVar8 <= uVar11)) goto LAB_00150c3f;
            piVar7[uVar11] = piVar9[lVar17];
            uVar11 = uVar11 + 1;
            lVar14 = lVar14 + 1;
          } while (lVar14 < piVar6[uVar18 + 1]);
          iVar10 = (int)uVar11;
        }
        if (lVar16 == lVar19 + -1) goto LAB_00150c3f;
        lVar16 = lVar16 + 1;
        uVar18 = (ulong)(uVar2 + 1);
        while ((int)uVar18 < piVar4[lVar16]) {
          if (uVar15 <= uVar18) goto LAB_00150c3f;
          piVar6[uVar18] = iVar10;
          uVar18 = uVar18 + 1;
          if (lVar5 <= lVar16) goto LAB_00150c3f;
        }
      } while (lVar16 != (ulong)uVar1 + 1);
    }
    if (lVar12 < (long)uVar15) {
      (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [lVar12] = iVar10;
      return;
    }
  }
LAB_00150c3f:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                ,0x18a,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
               );
}

Assistant:

void SparseLUImpl<Scalar,Index>::fixupL(const Index n, const IndexVector& perm_r, GlobalLU_t& glu)
{
  Index fsupc, i, j, k, jstart; 
  
  Index nextl = 0; 
  Index nsuper = (glu.supno)(n); 
  
  // For each supernode 
  for (i = 0; i <= nsuper; i++)
  {
    fsupc = glu.xsup(i); 
    jstart = glu.xlsub(fsupc); 
    glu.xlsub(fsupc) = nextl; 
    for (j = jstart; j < glu.xlsub(fsupc + 1); j++)
    {
      glu.lsub(nextl) = perm_r(glu.lsub(j)); // Now indexed into P*A
      nextl++;
    }
    for (k = fsupc+1; k < glu.xsup(i+1); k++)
      glu.xlsub(k) = nextl; // other columns in supernode i
  }
  
  glu.xlsub(n) = nextl; 
}